

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkBoolIndex(CheckerVisitor *this,GetSlotExpr *expr)

{
  bool bVar1;
  Node *pNVar2;
  SlotAccessExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *key;
  Expr *in_stack_ffffffffffffffd8;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    SlotAccessExpr::key(in_RSI);
    pNVar2 = &maybeEval(in_RDI,in_stack_ffffffffffffffd8,false)->super_Node;
    pNVar2 = &Node::asExpression(pNVar2)->super_Node;
    Node::op(pNVar2);
    bVar1 = isBooleanResultOperator(TO_BLOCK);
    if (bVar1) {
      pNVar2 = &SlotAccessExpr::key(in_RSI)->super_Node;
      report(in_RDI,pNVar2,0x4b);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkBoolIndex(const GetSlotExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *key = maybeEval(expr->key())->asExpression();

  if (isBooleanResultOperator(key->op())) {
    report(expr->key(), DiagnosticsId::DI_BOOL_AS_INDEX);
  }
}